

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>
* __thiscall
Lib::
IterTraits<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
::flatMap<Inferences::InductionContextFn>
          (IterTraits<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
           *this,InductionContextFn f)

{
  InductionContextFn f_00;
  VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  *in_RSI;
  FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *in_RDI;
  FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *this_00;
  VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  in_stack_ffffffffffffff98;
  Clause *in_stack_ffffffffffffffa0;
  FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *in_stack_ffffffffffffffa8;
  
  this_00 = in_RDI;
  VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  ::VirtualIterator((VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)&stack0xffffffffffffff98,in_RSI);
  f_00._lit = (Literal *)in_stack_ffffffffffffffa8;
  f_00._premise = in_stack_ffffffffffffffa0;
  getMappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>,Inferences::InductionContextFn>
            ((VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
              *)in_stack_ffffffffffffff98._core,f_00);
  getFlattenedIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>,Inferences::InductionContextFn,Lib::VirtualIterator<Inferences::InductionContext>>>
            ((MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>
              *)in_stack_ffffffffffffff98._core);
  iterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>,Inferences::InductionContextFn,Lib::VirtualIterator<Inferences::InductionContext>>>>
            (in_stack_ffffffffffffffa8);
  FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  ::~FlatteningIterator(this_00);
  MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>
  ::~MappingIterator((MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>
                      *)0x7ddde9);
  VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  ::~VirtualIterator((VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                      *)this_00);
  return (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>
          *)in_RDI;
}

Assistant:

IterTraits<FlatMapIter<Iter, F>> flatMap(F f)
  { return iterTraits(getFlattenedIterator(getMappingIterator(std::move(_iter), std::move(f)))); }